

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

string * __thiscall leveldb::ParsedInternalKey::DebugString_abi_cxx11_(ParsedInternalKey *this)

{
  string *s;
  ostream *poVar1;
  Slice *in_RSI;
  string *in_RDI;
  ostringstream ss;
  string *value;
  Slice *in_stack_fffffffffffffe28;
  string local_1a8 [32];
  ostringstream local_188 [392];
  
  value = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_188);
  s = (string *)std::operator<<((ostream *)local_188,'\'');
  Slice::ToString_abi_cxx11_(in_stack_fffffffffffffe28);
  Slice::Slice(in_RSI,s);
  EscapeString_abi_cxx11_((Slice *)value);
  poVar1 = std::operator<<((ostream *)s,local_1a8);
  poVar1 = std::operator<<(poVar1,"\' @ ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ulong)in_RSI[1].data_);
  poVar1 = std::operator<<(poVar1," : ");
  std::ostream::operator<<(poVar1,(int)in_RSI[1].size_);
  std::__cxx11::string::~string(local_1a8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe28);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

std::string ParsedInternalKey::DebugString() const {
  std::ostringstream ss;
  ss << '\'' << EscapeString(user_key.ToString()) << "' @ " << sequence << " : "
     << static_cast<int>(type);
  return ss.str();
}